

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

vector<float,_std::allocator<float>_> * cnn::as_vector(Tensor *v)

{
  uint uVar1;
  ulong __n;
  reference __dest;
  size_type sVar2;
  long in_RSI;
  allocator_type *in_RDI;
  vector<float,_std::allocator<float>_> *res;
  Dim *in_stack_ffffffffffffffb0;
  void *__src;
  allocator_type *__a;
  vector<float,_std::allocator<float>_> *this;
  undefined1 local_11;
  long local_10;
  
  local_11 = 0;
  __a = in_RDI;
  local_10 = in_RSI;
  uVar1 = Dim::size(in_stack_ffffffffffffffb0);
  __n = (ulong)uVar1;
  this = (vector<float,_std::allocator<float>_> *)&stack0xffffffffffffffee;
  std::allocator<float>::allocator((allocator<float> *)0x658930);
  std::vector<float,_std::allocator<float>_>::vector(this,__n,__a);
  std::allocator<float>::~allocator((allocator<float> *)0x658950);
  __dest = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)__a,0);
  __src = *(void **)(local_10 + 0x28);
  sVar2 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)__a);
  memcpy(__dest,__src,sVar2 << 2);
  return (vector<float,_std::allocator<float>_> *)in_RDI;
}

Assistant:

vector<real> as_vector(const Tensor& v) {
  vector<real> res(v.d.size());
#if HAVE_CUDA
  CUDA_CHECK(cudaMemcpy(&res[0], v.v, sizeof(real) * res.size(), cudaMemcpyDeviceToHost));
#else
  memcpy(&res[0], v.v, sizeof(real) * res.size());
#endif
  return res;
}